

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryOpenGL.cpp
# Opt level: O0

void __thiscall
Diligent::EngineFactoryOpenGLImpl::EnumerateAdapters
          (EngineFactoryOpenGLImpl *this,Version MinVersion,Uint32 *NumAdapters,
          GraphicsAdapterInfo *Adapters)

{
  uint *puVar1;
  uint local_2c;
  GraphicsAdapterInfo *local_28;
  GraphicsAdapterInfo *Adapters_local;
  Uint32 *NumAdapters_local;
  EngineFactoryOpenGLImpl *this_local;
  Version MinVersion_local;
  
  if (Adapters == (GraphicsAdapterInfo *)0x0) {
    *NumAdapters = 1;
  }
  else {
    local_2c = 1;
    local_28 = Adapters;
    Adapters_local = (GraphicsAdapterInfo *)NumAdapters;
    NumAdapters_local = (Uint32 *)this;
    this_local = (EngineFactoryOpenGLImpl *)MinVersion;
    puVar1 = std::min<unsigned_int>(&local_2c,NumAdapters);
    *(uint *)Adapters_local->Description = *puVar1;
    if (*(int *)Adapters_local->Description != 0) {
      SetDefaultGraphicsAdapterInfo(local_28);
    }
  }
  return;
}

Assistant:

void EngineFactoryOpenGLImpl::EnumerateAdapters(Version              MinVersion,
                                                Uint32&              NumAdapters,
                                                GraphicsAdapterInfo* Adapters) const
{
    if (Adapters == nullptr)
    {
        NumAdapters = 1;
        return;
    }

    NumAdapters = std::min(1u, NumAdapters);
    if (NumAdapters > 0)
    {
        SetDefaultGraphicsAdapterInfo(*Adapters);
    }
}